

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_UsesJointWarmStart_Test::
~TwoDimensionalQpTest_UsesJointWarmStart_Test(TwoDimensionalQpTest_UsesJointWarmStart_Test *this)

{
  (this->super_TwoDimensionalQpTest).super_Test._vptr_Test =
       (_func_int **)&PTR__TwoDimensionalQpTest_00203748;
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            (&(this->super_TwoDimensionalQpTest).solver_.workspace_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, UsesJointWarmStart) {
  VectorXd primal_warm_start(2);
  primal_warm_start << 1.0, -0.25;
  VectorXd dual_warm_start(1);
  dual_warm_start << -15.0 / 8.0;
  ASSERT_TRUE(solver_.SetWarmStart(primal_warm_start, dual_warm_start).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);
  EXPECT_EQ(solver_.iterations(), 1);
}